

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O2

void xmlSchematronFreeValidCtxt(xmlSchematronValidCtxtPtr ctxt)

{
  if (ctxt != (xmlSchematronValidCtxtPtr)0x0) {
    if (ctxt->xctxt != (xmlXPathContextPtr)0x0) {
      xmlXPathFreeContext(ctxt->xctxt);
    }
    if (ctxt->dict != (xmlDictPtr)0x0) {
      xmlDictFree(ctxt->dict);
    }
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlSchematronFreeValidCtxt(xmlSchematronValidCtxtPtr ctxt)
{
    if (ctxt == NULL)
        return;
    if (ctxt->xctxt != NULL)
        xmlXPathFreeContext(ctxt->xctxt);
    if (ctxt->dict != NULL)
        xmlDictFree(ctxt->dict);
    xmlFree(ctxt);
}